

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_api.c
# Opt level: O2

MPP_RET free_vid_ctx(H264dVideoCtx_t *p_Vid)

{
  MPP_RET extraout_EAX;
  MPP_RET extraout_EAX_00;
  MPP_RET MVar1;
  MPP_RET extraout_EAX_01;
  long lVar2;
  
  if (p_Vid == (H264dVideoCtx_t *)0x0) {
    MVar1 = 0x302e38;
    if (((byte)h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_api","input empty(%d).\n",(char *)0x0,0x8e);
      return extraout_EAX_01;
    }
  }
  else {
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
      if (p_Vid->spsSet[lVar2] != (h264_sps_t *)0x0) {
        mpp_osal_free("free_vid_ctx",p_Vid->spsSet[lVar2]);
      }
      p_Vid->spsSet[lVar2] = (h264_sps_t *)0x0;
      if (p_Vid->subspsSet[lVar2] != (H264_subSPS_t *)0x0) {
        recycle_subsps(p_Vid->subspsSet[lVar2]);
        if (p_Vid->subspsSet[lVar2] != (h264_subsps_t *)0x0) {
          mpp_osal_free("free_vid_ctx",p_Vid->subspsSet[lVar2]);
        }
      }
      p_Vid->subspsSet[lVar2] = (h264_subsps_t *)0x0;
    }
    for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
      if (p_Vid->ppsSet[lVar2] != (h264_pps_t *)0x0) {
        mpp_osal_free("free_vid_ctx",p_Vid->ppsSet[lVar2]);
      }
      p_Vid->ppsSet[lVar2] = (h264_pps_t *)0x0;
    }
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      free_dpb(p_Vid->p_Dpb_layer[lVar2]);
      if (p_Vid->p_Dpb_layer[lVar2] != (h264_dpb_buf_t *)0x0) {
        mpp_osal_free("free_vid_ctx",p_Vid->p_Dpb_layer[lVar2]);
      }
      p_Vid->p_Dpb_layer[lVar2] = (h264_dpb_buf_t *)0x0;
    }
    free_storable_picture(p_Vid->p_Dec,p_Vid->dec_pic);
    MVar1 = extraout_EAX;
    if (p_Vid->pic_st != (MppMemPool)0x0) {
      mpp_mem_pool_deinit_f("free_vid_ctx",p_Vid->pic_st);
      p_Vid->pic_st = (MppMemPool)0x0;
      MVar1 = extraout_EAX_00;
    }
  }
  return MVar1;
}

Assistant:

static MPP_RET free_vid_ctx(H264dVideoCtx_t *p_Vid)
{
    RK_U32 i = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;

    INP_CHECK(ret, !p_Vid);

    for (i = 0; i < MAXSPS; i++) {
        MPP_FREE(p_Vid->spsSet[i]);
        if (p_Vid->subspsSet[i])
            recycle_subsps(p_Vid->subspsSet[i]);
        MPP_FREE(p_Vid->subspsSet[i]);
    }

    for (i = 0; i < MAXPPS; i++)
        MPP_FREE(p_Vid->ppsSet[i]);

    for (i = 0; i < MAX_NUM_DPB_LAYERS; i++) {
        free_dpb(p_Vid->p_Dpb_layer[i]);
        MPP_FREE(p_Vid->p_Dpb_layer[i]);
    }

    free_storable_picture(p_Vid->p_Dec, p_Vid->dec_pic);

    if (p_Vid->pic_st) {
        mpp_mem_pool_deinit(p_Vid->pic_st);
        p_Vid->pic_st = NULL;
    }

__RETURN:
    return ret = MPP_OK;
}